

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xcursor.c
# Opt level: O2

void Set_XCursor(int x,int y)

{
  DLword *pDVar1;
  DLword *pDVar2;
  MXCURSOR *pMVar3;
  MXCURSOR *pMVar4;
  long lVar5;
  MXCURSOR **ppMVar6;
  DLword *bitmap;
  
  bitmap = IOPage->dlcursorbitmap;
  ppMVar6 = &cursorlist;
  pMVar3 = (MXCURSOR *)0x0;
  do {
    pMVar4 = pMVar3;
    ppMVar6 = &((MXCURSOR *)ppMVar6)->next->next;
    if ((MXCURSOR *)ppMVar6 == (MXCURSOR *)0x0) {
      ppMVar6 = (MXCURSOR **)malloc(0x30);
      for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 1) {
        ((MXCURSOR *)ppMVar6)->bitmap[lVar5] = bitmap[lVar5];
      }
      set_Xcursor(currentdsp,(uint8_t *)bitmap,x,0xf - y,&((MXCURSOR *)ppMVar6)->Xid,1);
LAB_00136dc5:
      ((MXCURSOR *)ppMVar6)->next = cursorlist;
      cursorlist = (MXCURSOR *)ppMVar6;
LAB_00136dd6:
      XDefineCursor(currentdsp->display_id,currentdsp->DisplayWindow,((MXCURSOR *)ppMVar6)->Xid);
      Current_Hot_X = x;
      Current_Hot_Y = 0xf - y;
      return;
    }
    lVar5 = 0;
    do {
      if (lVar5 == 0x10) {
        if ((MXCURSOR *)ppMVar6 == cursorlist) goto LAB_00136dd6;
        pMVar4->next = ((MXCURSOR *)ppMVar6)->next;
        goto LAB_00136dc5;
      }
      pDVar2 = ((MXCURSOR *)ppMVar6)->bitmap + lVar5;
      pDVar1 = bitmap + lVar5;
      pMVar3 = (MXCURSOR *)ppMVar6;
      lVar5 = lVar5 + 1;
    } while (*pDVar2 == *pDVar1);
  } while( true );
}

Assistant:

void Set_XCursor(int x, int y)
{
  /* compare cursor in IOPage memory with cursors we've seen before */
  struct MXCURSOR *clp, *clbp = NULL;
  DLword *newbm = ((DLword *)(IOPage->dlcursorbitmap));
  int i;

  XLOCK; /* No signals while setting the cursor */
  for (clp = cursorlist; clp != NULL; clbp = clp, clp = clp->next) {
    for (i = 0; i < CURSORHEIGHT; i++)
      if (clp->bitmap[i] != newbm[i]) break;
    if (i == CURSORHEIGHT) break;
  }

  if (clp == NULL) { /* it isn't there, push on a new one */
    clp = (struct MXCURSOR *)malloc(sizeof(struct MXCURSOR));
    /* and fill it up with the current new cursor */
    for (i = 0; i < CURSORHEIGHT; i++) clp->bitmap[i] = newbm[i];
#ifdef NEWXCURSOR
    /* JDS 000521 Added "15-" to fix cursor troubles at window edge */
    set_Xcursor(currentdsp, (uint8_t *)newbm, x, 15 - y, &(clp->Xid), 1);
#else
    set_Xcursor(currentdsp, (uint8_t *)newbm, 0, 0, &(clp->Xid), 1);
#endif /* NEWXCURSOR */
    clp->next = cursorlist;
    cursorlist = clp;
  } else
      /* found it, move it to the front of the list
         (this should reduce search time on the average by keeping
         the popular cursors near the front of the list)
         */
      if (clp != cursorlist) { /* don't move if it's already there */
    clbp->next = clp->next;
    clp->next = cursorlist;
    cursorlist = clp;
  }
  DefineCursor(currentdsp, currentdsp->DisplayWindow, &(clp->Xid));
  XUNLOCK(currentdsp); /* Signals OK now */

#ifdef NEWXCURSOR
  /* Save the hotspot for later position reporting/setting */

  Current_Hot_X = x;
  Current_Hot_Y = 15 - y; /* Added 15- to fix window-edge trouble */
#endif                    /* NEWXCURSOR */

}